

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O0

void __thiscall
tchecker::parsing::attributes_t::insert
          (attributes_t *this,shared_ptr<tchecker::parsing::attr_t> *attr)

{
  element_type *this_00;
  string *__a;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>
  local_48;
  shared_ptr<tchecker::parsing::attr_t> *local_18;
  shared_ptr<tchecker::parsing::attr_t> *attr_local;
  attributes_t *this_local;
  
  local_18 = attr;
  attr_local = (shared_ptr<tchecker::parsing::attr_t> *)this;
  this_00 = std::
            __shared_ptr_access<tchecker::parsing::attr_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<tchecker::parsing::attr_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)attr);
  __a = attr_t::key_abi_cxx11_(this_00);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>,_true>
            (&local_48,__a,local_18);
  std::
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>_>_>
  ::insert(&this->_attr,&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>
  ::~pair(&local_48);
  return;
}

Assistant:

void attributes_t::insert(std::shared_ptr<tchecker::parsing::attr_t> const & attr) { _attr.insert({attr->key(), attr}); }